

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg.c
# Opt level: O3

void pjpeg_destroy(pjpeg_t *pj)

{
  long lVar1;
  long lVar2;
  
  if (pj != (pjpeg_t *)0x0) {
    if (0 < pj->ncomponents) {
      lVar1 = 0x10;
      lVar2 = 0;
      do {
        free(*(void **)((long)&pj->components->width + lVar1));
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x20;
      } while (lVar2 < pj->ncomponents);
    }
    free(pj->components);
    free(pj);
    return;
  }
  return;
}

Assistant:

void pjpeg_destroy(pjpeg_t *pj)
{
    if (!pj)
        return;

    for (int i = 0; i < pj->ncomponents; i++)
        free(pj->components[i].data);
    free(pj->components);

    free(pj);
}